

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Integer.cpp
# Opt level: O1

Data * Integer::plus(vector<Data_*,_std::allocator<Data_*>_> *dataPara)

{
  pointer ppDVar1;
  Data *this;
  long lVar2;
  _func_int **pp_Var3;
  long lVar4;
  long lVar5;
  
  this = (Data *)operator_new(0x18);
  Data::Data(this);
  this->_vptr_Data = (_func_int **)&PTR__Integer_00109d28;
  this[1]._vptr_Data = (_func_int **)0x0;
  ppDVar1 = (dataPara->super__Vector_base<Data_*,_std::allocator<Data_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  lVar4 = (long)(dataPara->super__Vector_base<Data_*,_std::allocator<Data_*>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)ppDVar1;
  if (lVar4 != 0) {
    lVar4 = lVar4 >> 3;
    pp_Var3 = this[1]._vptr_Data;
    lVar5 = 0;
    do {
      lVar2 = __dynamic_cast(ppDVar1[lVar5],&Data::typeinfo,&typeinfo,0);
      pp_Var3 = (_func_int **)((long)pp_Var3 + *(long *)(lVar2 + 0x10));
      this[1]._vptr_Data = pp_Var3;
      lVar5 = lVar5 + 1;
    } while (lVar4 + (ulong)(lVar4 == 0) != lVar5);
  }
  return this;
}

Assistant:

Data *Integer::plus(std::vector<Data *> *dataPara) {
    auto result = new Integer(0);
    for (int i = 0; i < dataPara->size(); i++) {
        result->value += (dynamic_cast<Integer *>((*dataPara)[i]))->value;
    }
    return result;
}